

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBoxArray::local_collate_cpu(TagBoxArray *this,PinnedVector<IntVect> *v)

{
  PinnedVector<IntVect> *pPVar1;
  FabArray<amrex::TagBox> *this_00;
  int i;
  long lVar2;
  int *piVar3;
  int j;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  pointer pIVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Vector<int,_std::allocator<int>_> count;
  Vector<int,_std::allocator<int>_> offset;
  MFIter fai;
  Box local_12c;
  PinnedVector<IntVect> *local_110;
  _Vector_base<int,_std::allocator<int>_> local_108;
  FabArray<amrex::TagBox> *local_f0;
  _Vector_base<int,_std::allocator<int>_> local_e8;
  Array4<const_char> local_d0;
  MFIter local_90;
  
  iVar9 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.
                                       indexArray.super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 8) -
                       (long)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.indexArray.
                             super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  if (iVar9 != 0) {
    local_110 = v;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_108,(long)iVar9,
               (allocator_type *)&local_90);
    MFIter::MFIter(&local_90,(FabArrayBase *)this,'\0');
    local_f0 = &this->super_FabArray<amrex::TagBox>;
    while (this_00 = local_f0, local_90.currentIndex < local_90.endIndex) {
      FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(&local_d0,local_f0,&local_90);
      MFIter::fabbox(&local_12c,&local_90);
      lVar10 = (long)local_12c.smallend.vect[2];
      pcVar6 = local_d0.p +
               (((lVar10 - local_d0.begin.z) * local_d0.kstride +
                 ((long)local_12c.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride +
                (long)local_12c.smallend.vect[0]) - (long)local_d0.begin.x);
      iVar9 = 0;
      for (; lVar8 = (long)local_12c.smallend.vect[1], pcVar5 = pcVar6,
          lVar10 <= local_12c.bigend.vect[2]; lVar10 = lVar10 + 1) {
        for (; lVar2 = (long)local_12c.smallend.vect[0], pcVar4 = pcVar5,
            lVar8 <= local_12c.bigend.vect[1]; lVar8 = lVar8 + 1) {
          for (; lVar2 <= local_12c.bigend.vect[0]; lVar2 = lVar2 + 1) {
            iVar9 = (iVar9 + 1) - (uint)(*pcVar4 == '\0');
            pcVar4 = pcVar4 + 1;
          }
          pcVar5 = pcVar5 + local_d0.jstride;
        }
        pcVar6 = pcVar6 + local_d0.kstride;
      }
      piVar3 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      local_108._M_impl.super__Vector_impl_data._M_start[*piVar3] = iVar9;
      MFIter::operator++(&local_90);
    }
    MFIter::~MFIter(&local_90);
    local_90.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_e8,
               ((long)local_108._M_impl.super__Vector_impl_data._M_finish -
                (long)local_108._M_impl.super__Vector_impl_data._M_start >> 2) + 1,
               (value_type_conflict *)&local_90,(allocator_type *)&local_d0);
    std::
    partial_sum<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_108._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               local_108._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (local_e8._M_impl.super__Vector_impl_data._M_start + 1));
    pPVar1 = local_110;
    PODVector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
              (local_110,(long)local_e8._M_impl.super__Vector_impl_data._M_finish[-1]);
    if (pPVar1->m_size != 0) {
      MFIter::MFIter(&local_90,&this_00->super_FabArrayBase,'\0');
      while (local_90.currentIndex < local_90.endIndex) {
        iVar9 = local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar9 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[local_90.currentIndex];
        }
        if (0 < local_108._M_impl.super__Vector_impl_data._M_start[iVar9]) {
          pIVar7 = local_110->m_data + local_e8._M_impl.super__Vector_impl_data._M_start[iVar9];
          FabArray<amrex::TagBox>::const_array<amrex::TagBox,_0>(&local_d0,this_00,&local_90);
          MFIter::fabbox(&local_12c,&local_90);
          for (lVar10 = (long)local_12c.smallend.vect[2]; lVar8 = (long)local_12c.smallend.vect[1],
              (int)lVar10 <= local_12c.bigend.vect[2]; lVar10 = lVar10 + 1) {
            for (; lVar2 = (long)local_12c.smallend.vect[0], (int)lVar8 <= local_12c.bigend.vect[1];
                lVar8 = lVar8 + 1) {
              for (; (int)lVar2 <= local_12c.bigend.vect[0]; lVar2 = lVar2 + 1) {
                if (local_d0.p
                    [lVar2 + (((lVar8 - local_d0.begin.y) * local_d0.jstride +
                              (lVar10 - local_d0.begin.z) * local_d0.kstride) -
                             (long)local_d0.begin.x)] != '\0') {
                  pIVar7->vect[0] = (int)lVar2;
                  pIVar7->vect[1] = (int)lVar8;
                  pIVar7->vect[2] = (int)lVar10;
                  pIVar7 = pIVar7 + 1;
                }
              }
            }
          }
        }
        MFIter::operator++(&local_90);
      }
      MFIter::~MFIter(&local_90);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_e8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_108);
  }
  return;
}

Assistant:

void
TagBoxArray::local_collate_cpu (Gpu::PinnedVector<IntVect>& v) const
{
    if (this->local_size() == 0) return;

    Vector<int> count(this->local_size());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        Array4<char const> const& arr = this->const_array(fai);
        Box const& bx = fai.fabbox();
        int c = 0;
        AMREX_LOOP_3D(bx,i,j,k,
        {
            if (arr(i,j,k) != TagBox::CLEAR) ++c;
        });
        count[fai.LocalIndex()] = c;
    }

    Vector<int> offset(count.size()+1, 0);
    std::partial_sum(count.begin(), count.end(), offset.begin()+1);

    v.resize(offset.back());

    if (v.empty()) return;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter fai(*this); fai.isValid(); ++fai)
    {
        int li = fai.LocalIndex();
        if (count[li] > 0) {
            IntVect* p = v.data() + offset[li];
            Array4<char const> const& arr = this->const_array(fai);
            Box const& bx = fai.fabbox();
            AMREX_LOOP_3D(bx,i,j,k,
            {
                if (arr(i,j,k) != TagBox::CLEAR) {
                    *p++ = IntVect(AMREX_D_DECL(i,j,k));
                }
            });
        }
    }
}